

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_cmac_done(aes_cmac_ctx *ctx,uint8_t *mac)

{
  ulong local_30;
  size_t i;
  uint8_t zero [16];
  uint8_t *mac_local;
  aes_cmac_ctx *ctx_local;
  
  zero._8_8_ = mac;
  memset(&i,0,0x10);
  aes_ecb_encrypt(&ctx->key,(uint8_t *)&i,(uint8_t *)zero._8_8_);
  cmac_gfmul((uint8_t *)zero._8_8_);
  if (ctx->size != 0x10) {
    cmac_gfmul((uint8_t *)zero._8_8_);
    ctx->block[ctx->size] = 0x80;
    memset(ctx->block + (ulong)ctx->size + 1,0,(ulong)(0x10 - (ctx->size + 1)));
  }
  for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
    *(byte *)(zero._8_8_ + local_30) = *(byte *)(zero._8_8_ + local_30) ^ ctx->block[local_30];
  }
  aes_cmac_process(&ctx->key,(uint8_t *)zero._8_8_,ctx->last,0x10);
  return;
}

Assistant:

static void aes_cmac_done(aes_cmac_ctx* ctx, uint8_t* mac)
{
    uint8_t zero[16] = { 0 };
    aes_ecb_encrypt(&ctx->key, zero, mac);

    cmac_gfmul(mac);

    if (ctx->size != 16)
    {
        cmac_gfmul(mac);

        ctx->block[ctx->size] = 0x80;
        memset(ctx->block + ctx->size + 1, 0, 16 - (ctx->size + 1));
    }

    for (size_t i = 0; i < 16; i++)
    {
        mac[i] ^= ctx->block[i];
    }

    aes_cmac_process(&ctx->key, mac, ctx->last, 16);
}